

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockIterator.hpp
# Opt level: O2

bool __thiscall
gmlc::containers::BlockIterator<helics::Input_const,32,helics::Input_const*const*>::
checkEquivalence<helics::Input**>
          (BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> *this,Input **testv,
          int testoffset)

{
  Input **ppIVar1;
  
  ppIVar1 = this->vec;
  if ((ppIVar1 != testv) &&
     ((((testv == (Input **)0x0 || (ppIVar1 == (Input **)0x0)) || (*testv != (Input *)0x0)) ||
      (*ppIVar1 != (Input *)0x0)))) {
    return false;
  }
  return this->offset == testoffset;
}

Assistant:

bool checkEquivalence(OUTER2 testv, int testoffset) const
        {
            return (
                (testv == vec ||
                 ((testv != nullptr && *testv == nullptr) &&
                  (vec != nullptr && *vec == nullptr))) &&
                testoffset == offset);
        }